

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties::
CompactBreitWignerUncertainties
          (CompactBreitWignerUncertainties *this,double awri,double qx,bool lrx,
          vector<double,_std::allocator<double>_> *energies,
          vector<double,_std::allocator<double>_> *spins,vector<double,_std::allocator<double>_> *gt
          ,vector<double,_std::allocator<double>_> *gn,vector<double,_std::allocator<double>_> *gg,
          vector<double,_std::allocator<double>_> *gf,vector<double,_std::allocator<double>_> *der,
          vector<double,_std::allocator<double>_> *dgn,vector<double,_std::allocator<double>_> *dgg,
          vector<double,_std::allocator<double>_> *dgf)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined7 in_register_00000031;
  _Vector_base<double,_std::allocator<double>_> local_88;
  ListRecord local_70;
  
  pdVar1 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  generateList((vector<double,_std::allocator<double>_> *)&local_88,energies,spins,gt,gn,gg,gf,der,
               dgn,dgg,dgf);
  local_70.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_88._M_impl.super__Vector_impl_data._M_finish -
       (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3;
  local_70.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  local_70.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88._M_impl.super__Vector_impl_data._M_start;
  local_70.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88._M_impl.super__Vector_impl_data._M_finish;
  local_70.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl =
       (_Head_base<5UL,_long,_false>)
       (_Head_base<5UL,_long,_false>)((long)pdVar1 - (long)pdVar2 >> 3);
  local_70.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = CONCAT71(in_register_00000031,lrx) & 0xffffffff;
  local_70.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = qx;
  local_70.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = awri;
  CompactBreitWignerUncertainties(this,&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_70.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

CompactBreitWignerUncertainties( double awri, double qx, bool lrx,
                                 std::vector< double >&& energies,
                                 std::vector< double >&& spins,
                                 std::vector< double >&& gt,
                                 std::vector< double >&& gn,
                                 std::vector< double >&& gg,
                                 std::vector< double >&& gf,
                                 std::vector< double >&& der,
                                 std::vector< double >&& dgn,
                                 std::vector< double >&& dgg,
                                 std::vector< double >&& dgf ) :
  // no try ... catch: exceptions will be handled in the derived class
  CompactBreitWignerUncertainties(
          ListRecord( awri, qx, 0, lrx, energies.size(),
                      generateList( std::move( energies ),
                                    std::move( spins ),
                                    std::move( gt ), std::move( gn ),
                                    std::move( gg ), std::move( gf ),
                                    std::move( der ), std::move( dgn ),
                                    std::move( dgg ), std::move( dgf ) ) ) ) {}